

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall
chrono::ChBody::IntStateIncrement
          (ChBody *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double __x;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  char *__function;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  ChQuaternion<double> q_old;
  undefined1 local_98 [32];
  ulong local_78;
  ulong local_68;
  ChQuaternion<double> local_60;
  ChVector<double> local_40;
  undefined1 extraout_var [56];
  
  local_68 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  uVar11 = (ulong)off_x;
  if ((long)local_68 <= (long)uVar11) {
LAB_00506859:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  uVar10 = (Dv->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)uVar10 <= (long)(ulong)off_v) goto LAB_00506859;
  uVar9 = (x_new->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)uVar9 <= (long)uVar11) {
LAB_00506878:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  pdVar1 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar2 = (Dv->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar3 = (x_new->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar3[uVar11] = pdVar1[uVar11] + pdVar2[off_v];
  uVar11 = (ulong)(off_x + 1);
  if ((local_68 <= uVar11) || (uVar10 <= off_v + 1)) goto LAB_00506859;
  if (uVar9 <= uVar11) goto LAB_00506878;
  pdVar3[uVar11] = pdVar1[uVar11] + pdVar2[off_v + 1];
  uVar11 = (ulong)(off_x + 2);
  if ((local_68 <= uVar11) || (uVar10 <= off_v + 2)) goto LAB_00506859;
  if (uVar9 <= uVar11) goto LAB_00506878;
  uVar10 = (ulong)(off_x + 3);
  pdVar3[uVar11] = pdVar1[uVar11] + pdVar2[off_v + 2];
  local_98._8_8_ = 4;
  local_98._0_8_ = pdVar1 + uVar10;
  local_98._24_8_ = x;
  local_78 = uVar10;
  if ((long)uVar10 <= (long)(local_68 - 4)) {
    ChQuaternion<double>::
    ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_60,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)local_98,(type *)0x0);
    local_78 = (ulong)(off_v + 3);
    local_68 = (Dv->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_98._8_8_ = 3;
    local_98._0_8_ =
         (Dv->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + local_78;
    local_98._24_8_ = Dv;
    if ((long)local_78 <= (long)(local_68 - 3)) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_40,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)local_98,(type *)0x0);
      auVar4._8_8_ = local_40.m_data[2];
      auVar4._0_8_ = local_40.m_data[1];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_40.m_data[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_40.m_data[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_40.m_data[1] * local_40.m_data[1];
      auVar15 = vfmadd231sd_fma(auVar24,auVar15,auVar15);
      auVar15 = vfmadd213sd_fma(auVar20,auVar20,auVar15);
      if (auVar15._0_8_ <= 1e-30) {
        auVar7._8_8_ = 0x3fe0000000000000;
        auVar7._0_8_ = 0x3fe0000000000000;
        auVar12 = vmulpd_avx512vl(auVar4,auVar7);
        auVar22._8_8_ = 0x3ff0000000000000;
        auVar22._0_8_ = 0x3ff0000000000000;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_40.m_data[0] * 0.5;
        auVar15 = vunpcklpd_avx(auVar22,auVar16);
      }
      else {
        auVar15 = vsqrtsd_avx(auVar15,auVar15);
        __x = auVar15._0_8_ * 0.5;
        dVar14 = sin(__x);
        dVar14 = dVar14 / auVar15._0_8_;
        auVar18._0_8_ = cos(__x);
        auVar18._8_56_ = extraout_var;
        auVar12._0_8_ = dVar14 * local_40.m_data[1];
        auVar12._8_8_ = dVar14 * local_40.m_data[2];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar14 * local_40.m_data[0];
        auVar15 = vunpcklpd_avx(auVar18._0_16_,auVar21);
      }
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_60.m_data[1];
      auVar26._24_8_ = local_60.m_data[3];
      auVar26._16_8_ = local_60.m_data[2];
      auVar5 = vpermpd_avx2(ZEXT1632(auVar15),1);
      auVar6 = vpermpd_avx2(ZEXT1632(auVar12),0x15);
      auVar28._0_8_ = -local_60.m_data[1];
      auVar28._8_8_ = 0x8000000000000000;
      auVar27._0_8_ = -local_60.m_data[2];
      auVar27._8_8_ = -local_60.m_data[3];
      auVar4 = vunpcklpd_avx(auVar28,auVar25);
      auVar26._0_16_ = auVar4;
      auVar29._16_16_ = auVar12;
      auVar29._0_16_ = auVar15;
      auVar17._8_8_ = auVar12._0_8_;
      auVar17._0_8_ = auVar12._0_8_;
      auVar15 = vshufpd_avx(auVar15,auVar15,3);
      auVar13._0_8_ = auVar5._0_8_ * auVar4._0_8_;
      auVar13._8_8_ = auVar5._8_8_ * auVar4._8_8_;
      auVar13._16_8_ = auVar5._16_8_ * local_60.m_data[2];
      auVar13._24_8_ = auVar5._24_8_ * local_60.m_data[3];
      auVar5._8_8_ = local_60.m_data[0];
      auVar5._0_8_ = local_60.m_data[0];
      auVar5._16_8_ = local_60.m_data[0];
      auVar5._24_8_ = local_60.m_data[0];
      auVar13 = vfmadd132pd_avx512vl(auVar29,auVar13,auVar5);
      auVar23._24_8_ = local_60.m_data[3];
      auVar23._16_8_ = local_60.m_data[3];
      auVar17._16_16_ = auVar15;
      auVar19._16_16_ = auVar28;
      auVar19._0_16_ = auVar27;
      auVar23._0_16_ = auVar27;
      auVar5 = vpermpd_avx2(auVar23,0x24);
      auVar15 = vfmadd213pd_fma(auVar17,auVar5,auVar13);
      auVar5 = vpermpd_avx2(auVar26,0x66);
      auVar5 = vshufpd_avx(auVar19,auVar5,9);
      auVar15 = vfmadd213pd_fma(auVar5,auVar6,ZEXT1632(auVar15));
      local_98 = ZEXT1632(auVar15);
      if ((long)uVar10 <=
          (x_new->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -4) {
        pdVar2 = (x_new->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar11 = 4;
        pdVar1 = pdVar2 + uVar10;
        if (((ulong)pdVar1 & 7) == 0) {
          uVar8 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar8 < 4) {
            uVar11 = (ulong)uVar8;
          }
          if (uVar8 == 0) goto LAB_0050681b;
        }
        memcpy(pdVar1,local_98,(ulong)(uint)((int)uVar11 * 8));
LAB_0050681b:
        if ((uint)uVar11 < 4) {
          uVar9 = (ulong)((uint)uVar11 * 8);
          memcpy(pdVar2 + uVar10 + uVar11,local_98 + uVar9,0x20 - uVar9);
        }
        return;
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_005068c3;
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_005068c3:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChBody::IntStateIncrement(const unsigned int off_x,  // offset in x state vector
                               ChState& x_new,            // state vector, position part, incremented result
                               const ChState& x,          // state vector, initial position part
                               const unsigned int off_v,  // offset in v state vector
                               const ChStateDelta& Dv     // state vector, increment
) {
    // ADVANCE POSITION:
    x_new(off_x) = x(off_x) + Dv(off_v);
    x_new(off_x + 1) = x(off_x + 1) + Dv(off_v + 1);
    x_new(off_x + 2) = x(off_x + 2) + Dv(off_v + 2);

    // ADVANCE ROTATION: R_new = DR_a * R_old
    // (using quaternions, local or abs:  q_new = Dq_a * q_old =  q_old * Dq_l  )
    ChQuaternion<> q_old(x.segment(off_x + 3, 4));
    ChQuaternion<> rel_q; rel_q.Q_from_Rotv(Dv.segment(off_v + 3, 3));
    ChQuaternion<> q_new = q_old * rel_q;
    x_new.segment(off_x + 3, 4) = q_new.eigen();
}